

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t fileRead2(void *buf,size_t count,file_t file)

{
  err_t eVar1;
  size_t read;
  err_t code;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  void *local_8;
  
  eVar1 = fileRead((size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(file_t)0x11494c);
  local_8 = in_stack_ffffffffffffffd0;
  if ((eVar1 != 0) && (eVar1 != 0xffffffff)) {
    local_8 = (void *)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

size_t fileRead2(void* buf, size_t count, file_t file)
{
	err_t code;
	size_t read;
	code = fileRead(&read, buf, count, file);
	if (code != ERR_OK && code != ERR_MAX)
		return SIZE_MAX;
	return read;
}